

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_2::IdentityGeometryShaderTestCase::createInstance
          (IdentityGeometryShaderTestCase *this,Context *context)

{
  PassthroughTestInstance *this_00;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vector<float,_4> local_17c [2];
  Vector<float,_4> local_15c;
  undefined4 local_14c;
  undefined1 local_148 [4];
  float level;
  Params params;
  Context *context_local;
  IdentityGeometryShaderTestCase *this_local;
  
  params.message.field_2._8_8_ = context;
  PassthroughTestInstance::Params::Params((Params *)local_148);
  local_14c = 0x41600000;
  local_148[0] = true;
  level = 14.0;
  params.useTessLevels = false;
  params._1_3_ = 0x416000;
  params.tessLevels.inner[0] = 14.0;
  params.tessLevels.inner[1] = 14.0;
  params.tessLevels.outer[0] = 14.0;
  params.tessLevels.outer[1] = 14.0;
  params.tessLevels.outer[2] = (float)this->m_primitiveType;
  params.tessLevels.outer[3] =
       (float)(4 - (uint)(this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES));
  tcu::Vector<float,_4>::Vector(&local_15c,-0.9,-0.9,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,&local_15c);
  tcu::Vector<float,_4>::Vector(local_17c,-0.9,0.9,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,local_17c);
  tcu::Vector<float,_4>::Vector(&local_18c,0.9,-0.9,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,&local_18c);
  tcu::Vector<float,_4>::Vector(&local_19c,0.9,0.9,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,&local_19c);
  params.vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  params.vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  std::__cxx11::string::operator=((string *)params.pipelineCases,"tese_to_geom");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[0].tessEvalShaderName.field_2._M_local_buf + 8),"geom")
  ;
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[0].geomShaderName.field_2._M_local_buf + 8),
             "passthrough geometry shader");
  params.pipelineCases[0].description.field_2._M_local_buf[8] = '\x01';
  params.pipelineCases[0].description.field_2._M_local_buf[9] = '\0';
  std::__cxx11::string::operator=((string *)(params.pipelineCases + 1),"tese_to_frag");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].tessEvalShaderName.field_2._M_local_buf + 8),"geom")
  ;
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].geomShaderName.field_2._M_local_buf + 8),
             "no geometry shader in the pipeline");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].description.field_2._M_local_buf + 8),
             "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\nRendering two images, first with and second without a geometry shader. Expecting similar results.\nUsing additive blending to detect overlap.\n"
            );
  this_00 = (PassthroughTestInstance *)operator_new(0x140);
  PassthroughTestInstance::PassthroughTestInstance
            (this_00,(Context *)params.message.field_2._8_8_,(Params *)local_148);
  PassthroughTestInstance::Params::~Params((Params *)local_148);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* IdentityGeometryShaderTestCase::createInstance (Context& context) const
{
	PassthroughTestInstance::Params params;

	const float level		   = 14.0;
	params.useTessLevels	   = true;
	params.tessLevels.inner[0] = level;
	params.tessLevels.inner[1] = level;
	params.tessLevels.outer[0] = level;
	params.tessLevels.outer[1] = level;
	params.tessLevels.outer[2] = level;
	params.tessLevels.outer[3] = level;

	params.primitiveType	   = m_primitiveType;
	params.inputPatchVertices  = (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 4);

	params.vertices.push_back(tcu::Vec4( -0.9f, -0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4( -0.9f,  0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4(  0.9f, -0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4(  0.9f,  0.9f, 0.0f, 1.0f ));

	params.pipelineCases[0].useTessellation		= true;
	params.pipelineCases[0].useGeometry			= true;
	params.pipelineCases[0].tessEvalShaderName	= "tese_to_geom";
	params.pipelineCases[0].geomShaderName		= "geom";
	params.pipelineCases[0].description			= "passthrough geometry shader";

	params.pipelineCases[1].useTessellation		= true;
	params.pipelineCases[1].useGeometry			= false;
	params.pipelineCases[1].tessEvalShaderName	= "tese_to_frag";
	params.pipelineCases[1].geomShaderName		= "geom";
	params.pipelineCases[1].description			= "no geometry shader in the pipeline";

	params.message = "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
					 "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
					 "Using additive blending to detect overlap.\n";

	return new PassthroughTestInstance(context, params);
}